

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_Test::
TEST_MockCheckedActualCall_unExpectedParameterName_Test
          (TEST_MockCheckedActualCall_unExpectedParameterName_Test *this)

{
  TEST_MockCheckedActualCall_unExpectedParameterName_Test *this_local;
  
  memset(this,0,0x20);
  TEST_GROUP_CppUTestGroupMockCheckedActualCall::TEST_GROUP_CppUTestGroupMockCheckedActualCall
            (&this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall);
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockCheckedActualCall_unExpectedParameterName_Test_0032ffd8;
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}